

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

Maybe<const_kj::Exception_&> __thiscall
kj::InFlightExceptionIterator::next(InFlightExceptionIterator *this)

{
  char *pcVar1;
  long *in_RSI;
  Exception *pEVar2;
  
  pEVar2 = (Exception *)*in_RSI;
  if (pEVar2 == (Exception *)0x0) {
    pEVar2 = (Exception *)0x0;
  }
  else {
    anon_unknown_70::validateExceptionPointer((ExceptionImpl *)&pEVar2[-1].details.builder.disposer)
    ;
    pcVar1 = pEVar2[1].file;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = pcVar1 + 8;
    }
    *in_RSI = (long)pcVar1;
  }
  this->ptr = pEVar2;
  return (Maybe<const_kj::Exception_&>)(Exception *)this;
}

Assistant:

Maybe<const Exception&> InFlightExceptionIterator::next() {
  if (ptr == nullptr) return kj::none;

  const ExceptionImpl* result = static_cast<const ExceptionImpl*>(ptr);
  validateExceptionPointer(result);
  ptr = result->nextCurrentException;
  return *result;
}